

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

mat<4UL,_4UL> *
operator*(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *lhs,mat<4UL,_4UL> *rhs)

{
  long lVar1;
  size_t idx;
  long lVar3;
  double *pdVar4;
  bool bVar5;
  double ret;
  double dVar6;
  vec<4UL,_double> local_50;
  size_t sVar2;
  
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  pdVar4 = lhs->rows[3].data + 3;
  lVar3 = 3;
  do {
    sVar2 = 4;
    do {
      idx = sVar2 - 1;
      mat<4UL,_4UL>::col(&local_50,rhs,idx);
      dVar6 = 0.0;
      lVar1 = 0;
      do {
        dVar6 = dVar6 + pdVar4[lVar1] * local_50.data[lVar1 + 3];
        lVar1 = lVar1 + -1;
      } while (lVar1 != -4);
      __return_storage_ptr__->rows[lVar3].data[sVar2 - 1] = dVar6;
      sVar2 = idx;
    } while (idx != 0);
    pdVar4 = pdVar4 + -4;
    bVar5 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar5);
  return __return_storage_ptr__;
}

Assistant:

mat<R1, C2> operator*(const mat<R1, C1>& lhs, const mat<C1, C2>& rhs)
{
    mat<R1, C2> result;
    for (size_t i = R1; i--;)
        for (size_t j = C2; j--; result[i][j] = dot(lhs[i], rhs.col(j)))
            ;
    return result;
}